

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

void Imath_2_5::extractEulerZYX<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  float fVar1;
  Vec3<float> local_118;
  Vec3<float> local_108;
  Vec3<float> local_f8;
  Matrix44<float> local_e8;
  undefined1 local_a8 [24];
  float local_90;
  float local_8c;
  Vec3<float> local_88;
  undefined8 local_7c;
  float afStack_74 [3];
  Matrix44<float> local_68;
  
  local_f8.z = mat->x[0][2];
  local_f8.x = *(float *)((long)(mat->x + 0) + 0);
  local_f8.y = *(float *)((long)(mat->x + 0) + 4);
  local_108.z = mat->x[1][2];
  local_108.x = *(float *)((long)(mat->x + 1) + 0);
  local_108.y = *(float *)((long)(mat->x + 1) + 4);
  local_118.z = mat->x[2][2];
  local_118.x = *(float *)((long)(mat->x + 2) + 0);
  local_118.y = *(float *)((long)(mat->x + 2) + 4);
  Vec3<float>::normalize(&local_f8);
  Vec3<float>::normalize(&local_108);
  Vec3<float>::normalize(&local_118);
  local_a8._0_4_ = local_f8.x;
  local_a8._4_4_ = local_f8.y;
  local_a8._8_4_ = local_f8.z;
  local_a8._12_4_ = 0.0;
  local_a8._16_4_ = local_108.x;
  local_a8._20_4_ = local_108.y;
  local_90 = local_108.z;
  local_8c = 0.0;
  local_88.x = local_118.x;
  local_88.y = local_118.y;
  local_88.z = local_118.z;
  local_7c._0_4_ = 0.0;
  local_7c._4_4_ = 0.0;
  afStack_74[0] = 0.0;
  afStack_74[1] = 0.0;
  afStack_74[2] = 1.0;
  local_e8.x[0][2] = atan2f(local_108.x,local_f8.x);
  rot->x = -local_e8.x[0][2];
  local_68.x[1][3] = 0.0;
  local_68.x[2][0] = 0.0;
  local_68.x[2][3] = 0.0;
  local_68.x[3][0] = 0.0;
  local_68.x[0][1] = 0.0;
  local_68.x[0][2] = 0.0;
  local_68.x[0][3] = 0.0;
  local_68.x[1][0] = 0.0;
  local_68.x[3][1] = 0.0;
  local_68.x[3][2] = 0.0;
  local_68.x[0][0] = 1.0;
  local_68.x[1][1] = 1.0;
  local_68.x[1][2] = 0.0;
  local_68.x[2][1] = 0.0;
  local_68.x[2][2] = 1.0;
  local_68.x[3][3] = 1.0;
  local_e8.x[0][0] = 0.0;
  local_e8.x[0][1] = 0.0;
  Matrix44<float>::rotate<float>(&local_68,(Vec3<float> *)&local_e8);
  Matrix44<float>::operator*(&local_e8,&local_68,(Matrix44<float> *)local_a8);
  local_68.x[1][1] = local_e8.x[1][1];
  local_68.x[1][2] = local_e8.x[1][2];
  fVar1 = atan2f(-local_e8.x[2][0],
                 SQRT(local_e8.x[2][2] * local_e8.x[2][2] + local_e8.x[2][1] * local_e8.x[2][1]));
  rot->y = -fVar1;
  fVar1 = atan2f(-local_68.x[1][2],local_68.x[1][1]);
  rot->z = -fVar1;
  return;
}

Assistant:

void
extractEulerZYX (const Matrix44<T> &mat, Vec3<T> &rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize();
    j.normalize();
    k.normalize();

    Matrix44<T> M (i[0], i[1], i[2], 0, 
		   j[0], j[1], j[2], 0, 
		   k[0], k[1], k[2], 0, 
		   0,    0,    0,    1);

    //
    // Extract the first angle, rot.x.
    // 

    rot.x = -Math<T>::atan2 (M[1][0], M[0][0]);

    //
    // Remove the x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (0, 0, -rot.x));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy = Math<T>::sqrt (N[2][2]*N[2][2] + N[2][1]*N[2][1]);
    rot.y = -Math<T>::atan2 (-N[2][0], cy);
    rot.z = -Math<T>::atan2 (-N[1][2], N[1][1]);
}